

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O1

GuessScore __thiscall
csv::internals::calculate_score(internals *this,string_view head,CSVFormat *format)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  mapped_type *pmVar6;
  long lVar7;
  __hash_code __code;
  ulong uVar8;
  ulong uVar9;
  mapped_type mVar10;
  __node_base_ptr p_Var11;
  size_t i;
  ulong uVar12;
  __node_base _Var13;
  _Elt_pointer pCVar14;
  undefined1 auVar15 [16];
  double dVar16;
  GuessScore GVar17;
  unsigned_long row_size;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  row_tally;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  row_when;
  RowCollection rows;
  stringstream source;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parser;
  ColNamesPtr local_a28;
  double local_a18;
  double dStack_a10;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a08;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_9d0;
  ThreadSafeDeque<csv::CSVRow> local_998;
  stringstream local_8e0 [128];
  ios_base local_860 [264];
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_758;
  
  local_758.super_IBasicCSVParser._vptr_IBasicCSVParser = (_func_int **)0x0;
  local_758.super_IBasicCSVParser.current_row.data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_long_const,unsigned_long>const*>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_a08,&local_758,
             &local_758.super_IBasicCSVParser.current_row.data.
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,0,local_8e0,&local_998,&local_9d0);
  local_758.super_IBasicCSVParser._vptr_IBasicCSVParser = (_func_int **)0x0;
  local_758.super_IBasicCSVParser.current_row.data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = &local_758.super_IBasicCSVParser.current_row.data.
            super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_long_const,unsigned_long>const*>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_9d0,&local_758,p_Var1,0,local_8e0,&local_998,&local_a28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,(char *)head._M_len,(allocator<char> *)&local_998);
  std::__cxx11::stringstream::stringstream(local_8e0,(string *)&local_758,_S_out|_S_in);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_758.super_IBasicCSVParser._vptr_IBasicCSVParser != p_Var1) {
    operator_delete(local_758.super_IBasicCSVParser._vptr_IBasicCSVParser,
                    (ulong)((long)&(local_758.super_IBasicCSVParser.current_row.data.
                                    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque(&local_998,100);
  local_a28.super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a28.super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::StreamParser(&local_758,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_8e0,(CSVFormat *)head._M_str,&local_a28);
  if (local_a28.super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a28.super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_758.super_IBasicCSVParser._records = &local_998;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::next(&local_758,10000000);
  uVar12 = 0;
  do {
    if (((long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_start._M_last -
         (long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) * -0x3333333333333333 +
        ((long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3) * -0x3333333333333333 +
        (((long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node -
          (long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0xc <= uVar12) {
      local_a18 = 0.0;
      mVar10 = 0;
      if (local_a08._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Var13._M_nxt = local_a08._M_before_begin._M_nxt;
        do {
          local_a28.super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)_Var13._M_nxt[1]._M_nxt;
          lVar7 = (long)local_a28.
                        super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr * (long)_Var13._M_nxt[2]._M_nxt;
          auVar15._8_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar15._0_8_ = lVar7;
          auVar15._12_4_ = 0x45300000;
          dStack_a10 = auVar15._8_8_ - 1.9342813113834067e+25;
          dVar16 = dStack_a10 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
          if (local_a18 < dVar16) {
            local_a18 = dVar16;
            pmVar6 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_9d0,(key_type *)&local_a28);
            mVar10 = *pmVar6;
          }
          _Var13._M_nxt = (_Var13._M_nxt)->_M_nxt;
        } while (_Var13._M_nxt != (_Hash_node_base *)0x0);
      }
      StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~StreamParser(&local_758);
      std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::~deque(&local_998.data);
      std::condition_variable::~condition_variable(&local_998._cond);
      std::__cxx11::stringstream::~stringstream(local_8e0);
      std::ios_base::~ios_base(local_860);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_9d0);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_a08);
      GVar17.header = mVar10;
      GVar17.score = local_a18;
      return GVar17;
    }
    uVar8 = ((long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x3333333333333333 +
            uVar12;
    if (uVar8 < 0xc) {
      pCVar14 = local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur + uVar12;
    }
    else {
      if ((long)uVar8 < 1) {
        uVar9 = ~(~uVar8 / 0xc);
      }
      else {
        uVar9 = uVar8 / 0xc;
      }
      pCVar14 = local_998.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                super__Deque_impl_data._M_start._M_node[uVar9] + uVar9 * -0xc + uVar8;
    }
    peVar2 = (element_type *)pCVar14->row_length;
    if (peVar2 != (element_type *)0x0) {
      p_Var3 = local_a08._M_buckets[(ulong)peVar2 % local_a08._M_bucket_count];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var3, p_Var11 = p_Var3->_M_nxt,
         peVar2 != (element_type *)p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var4 = p_Var11->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var4[1]._M_nxt % local_a08._M_bucket_count !=
               (ulong)peVar2 % local_a08._M_bucket_count) ||
             (p_Var5 = p_Var11, p_Var11 = p_Var4, peVar2 == (element_type *)p_Var4[1]._M_nxt))
          goto LAB_0010791d;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_0010791d:
      local_a28.super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
        pmVar6 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a08,(key_type *)&local_a28);
        *pmVar6 = 1;
        local_a28.super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pCVar14->row_length;
        pmVar6 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_9d0,(key_type *)&local_a28);
        *pmVar6 = uVar12;
      }
      else {
        pmVar6 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a08,(key_type *)&local_a28);
        *pmVar6 = *pmVar6 + 1;
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

CSV_INLINE GuessScore calculate_score(csv::string_view head, const CSVFormat& format) {
            // Frequency counter of row length
            std::unordered_map<size_t, size_t> row_tally = { { 0, 0 } };

            // Map row lengths to row num where they first occurred
            std::unordered_map<size_t, size_t> row_when = { { 0, 0 } };

            // Parse the CSV
            std::stringstream source(head.data());
            RowCollection rows;

            StreamParser<std::stringstream> parser(source, format);
            parser.set_output(rows);
            parser.next();

            for (size_t i = 0; i < rows.size(); i++) {
                auto& row = rows[i];

                // Ignore zero-length rows
                if (row.size() > 0) {
                    if (row_tally.find(row.size()) != row_tally.end()) {
                        row_tally[row.size()]++;
                    }
                    else {
                        row_tally[row.size()] = 1;
                        row_when[row.size()] = i;
                    }
                }
            }

            double final_score = 0;
            size_t header_row = 0;

            // Final score is equal to the largest
            // row size times rows of that size
            for (auto& pair : row_tally) {
                auto row_size = pair.first;
                auto row_count = pair.second;
                double score = (double)(row_size * row_count);
                if (score > final_score) {
                    final_score = score;
                    header_row = row_when[row_size];
                }
            }

            return {
                final_score,
                header_row
            };
        }